

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_lock.cpp
# Opt level: O2

void __thiscall duckdb::StorageLock::StorageLock(StorageLock *this)

{
  make_shared_ptr<duckdb::StorageLockInternals>();
  return;
}

Assistant:

StorageLock::StorageLock() : internals(make_shared_ptr<StorageLockInternals>()) {
}